

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

void __thiscall DSBarInfo::Tick(DSBarInfo *this)

{
  int iVar1;
  SBarInfo *pSVar2;
  SBarInfoMainBlock *pSVar3;
  
  DBaseStatusBar::Tick(&this->super_DBaseStatusBar);
  FMugShot::Tick(&this->script->MugShot,(this->super_DBaseStatusBar).CPlayer);
  if ((long)this->currentPopup != 0) {
    Popup::tick((Popup *)&this->script->popups[(long)this->currentPopup + -1].transition);
    pSVar2 = this->script;
    if ((pSVar2->popups[(long)this->currentPopup + -1].opened == false) &&
       (pSVar2->popups[(long)this->currentPopup + -1].moving == false)) {
      iVar1 = this->pendingPopup;
      this->currentPopup = iVar1;
      if ((long)iVar1 != 0) {
        pSVar2->popups[(long)iVar1 + -1].opened = true;
        pSVar2->popups[(long)iVar1 + -1].moving = true;
      }
    }
    pSVar3 = this->lastPopup;
    if (pSVar3 != (SBarInfoMainBlock *)0x0) {
      (*(pSVar3->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
                (pSVar3,0,this,0);
    }
  }
  if ((long)this->lastHud != -1) {
    pSVar3 = this->script->huds[this->lastHud];
    (*(pSVar3->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
              (pSVar3,0,this,0);
  }
  pSVar3 = this->lastInventoryBar;
  if ((pSVar3 != (SBarInfoMainBlock *)0x0) &&
     (0 < ((this->super_DBaseStatusBar).CPlayer)->inventorytics)) {
    (*(pSVar3->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
              (pSVar3,0,this,0);
    return;
  }
  return;
}

Assistant:

void Tick ()
	{
		DBaseStatusBar::Tick();

		script->MugShot.Tick(CPlayer);
		if(currentPopup != POP_None)
		{
			script->popups[currentPopup-1].tick();
			if(script->popups[currentPopup-1].opened == false && script->popups[currentPopup-1].isDoneMoving())
			{
				currentPopup = pendingPopup;
				if(currentPopup != POP_None)
					script->popups[currentPopup-1].open();
			}

			if (lastPopup != NULL) lastPopup->Tick(NULL, this, false);
		}

		if(lastHud != -1)
			script->huds[lastHud]->Tick(NULL, this, false);
		if(lastInventoryBar != NULL && CPlayer->inventorytics > 0)
			lastInventoryBar->Tick(NULL, this, false);
	}